

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::RsProdSyntax::isKind(SyntaxKind kind)

{
  bool local_9;
  SyntaxKind kind_local;
  
  if ((kind - RsCase < 2) || (kind - RsIfElse < 3)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool RsProdSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::RsCase:
        case SyntaxKind::RsCodeBlock:
        case SyntaxKind::RsIfElse:
        case SyntaxKind::RsProdItem:
        case SyntaxKind::RsRepeat:
            return true;
        default:
            return false;
    }
}